

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

void crnlib::image_utils::print_ssim(image_u8 *src_img,image_u8 *dst_img)

{
  return;
}

Assistant:

void print_ssim(const image_u8& src_img, const image_u8& dst_img) {
  (void)src_img;
  (void)dst_img;
  //double y_ssim = compute_ssim(src_img, dst_img, -1);
  //console::printf("Luma MSSIM: %f, Scaled: %f", y_ssim, (y_ssim - .8f) / .2f);

  //double r_ssim = compute_ssim(src_img, dst_img, 0);
  //console::printf("   R MSSIM: %f", r_ssim);

  //double g_ssim = compute_ssim(src_img, dst_img, 1);
  //console::printf("   G MSSIM: %f", g_ssim);

  //double b_ssim = compute_ssim(src_img, dst_img, 2);
  //console::printf("   B MSSIM: %f", b_ssim);
}